

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlParserInputBufferGrow(xmlParserInputBufferPtr in,int len)

{
  void *pvVar1;
  xmlInputReadCallback p_Var2;
  int iVar3;
  uint uVar4;
  xmlCharEncError xVar5;
  xmlBufPtr buf;
  xmlChar *pxVar6;
  uint uVar7;
  size_t sizeOut;
  
  if (in == (xmlParserInputBufferPtr)0x0) {
    return -1;
  }
  if (in->error != 0) {
    return -1;
  }
  uVar7 = 4000;
  if (4000 < len) {
    uVar7 = len;
  }
  if (in->readcallback == (xmlInputReadCallback)0x0) {
    uVar4 = 0;
LAB_00157745:
    if (in->encoder != (xmlCharEncodingHandlerPtr)0x0) {
      sizeOut = -(ulong)(in->readcallback != (xmlInputReadCallback)0x0) | (ulong)uVar7;
      xVar5 = xmlCharEncInput(in,&sizeOut,0);
      uVar4 = -(uint)(xVar5 != XML_ENC_ERR_SUCCESS) | (uint)sizeOut;
    }
  }
  else {
    if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
      buf = in->buffer;
LAB_001576ed:
      iVar3 = xmlBufGrow(buf,(ulong)uVar7);
      if (-1 < iVar3) {
        pvVar1 = in->context;
        p_Var2 = in->readcallback;
        pxVar6 = xmlBufEnd(buf);
        uVar4 = (*p_Var2)(pvVar1,(char *)pxVar6,uVar7);
        if (((int)uVar4 < 1) && (in->readcallback = endOfInput, (int)uVar4 < 0)) {
          iVar3 = 0x5dc;
          if (uVar4 != 0xffffffff) {
            iVar3 = -uVar4;
          }
          in->error = iVar3;
          return -1;
        }
        iVar3 = xmlBufAddLen(buf,(ulong)uVar4);
        if (-1 < iVar3) goto LAB_00157745;
      }
    }
    else {
      buf = in->raw;
      if (buf != (xmlBufPtr)0x0) goto LAB_001576ed;
      buf = xmlBufCreate(6000);
      in->raw = buf;
      if (buf != (xmlBufPtr)0x0) goto LAB_001576ed;
    }
    in->error = 2;
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

int
xmlParserInputBufferGrow(xmlParserInputBufferPtr in, int len) {
    int res = 0;

    if ((in == NULL) || (in->error))
        return(-1);

    if (len < MINLEN)
        len = MINLEN;

    /*
     * Call the read method for this I/O type.
     */
    if (in->readcallback != NULL) {
        xmlBufPtr buf;

        if (in->encoder == NULL) {
            buf = in->buffer;
        } else {
            /*
             * Some users only set 'encoder' and expect us to create
             * the raw buffer lazily.
             */
            if (in->raw == NULL) {
                in->raw = xmlBufCreate(XML_IO_BUFFER_SIZE);
                if (in->raw == NULL) {
                    in->error = XML_ERR_NO_MEMORY;
                    return(-1);
                }
            }
            buf = in->raw;
        }

        if (xmlBufGrow(buf, len) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }

	res = in->readcallback(in->context, (char *)xmlBufEnd(buf), len);
	if (res <= 0)
	    in->readcallback = endOfInput;
        if (res < 0) {
            if (res == -1)
                in->error = XML_IO_UNKNOWN;
            else
                in->error = -res;
            return(-1);
        }

        if (xmlBufAddLen(buf, res) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }
    }

    /*
     * Handle encoding.
     */
    if (in->encoder != NULL) {
        size_t sizeOut;

        /*
         * Don't convert whole buffer when reading from memory.
         */
        if (in->readcallback == NULL)
            sizeOut = len;
        else
            sizeOut = SIZE_MAX;

	if (xmlCharEncInput(in, &sizeOut, /* flush */ 0) !=
            XML_ENC_ERR_SUCCESS)
	    return(-1);
        res = sizeOut;
    }
    return(res);
}